

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balk.cpp
# Opt level: O1

void __thiscall Balk::solve_balk(Balk *this)

{
  element_type *peVar1;
  pointer psVar2;
  shared_ptr<Term> *el;
  pointer psVar3;
  iterator iVar4;
  shared_ptr<Term> last;
  shared_ptr<Term> first;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  vector<double,_std::allocator<double>_> local_30;
  
  iVar4._M_current =
       (this->terms).
       super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48 = (element_type *)0x0;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58 = (element_type *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  for (; iVar4._M_current !=
         (this->terms).
         super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>._M_impl.
         super__Vector_impl_data._M_finish; iVar4._M_current = iVar4._M_current + 1) {
    peVar1 = ((iVar4._M_current)->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((peVar1->shift == 0) && (peVar1->initial_variable == false)) {
      local_48 = peVar1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (a_Stack_40,
                 &((iVar4._M_current)->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
      break;
    }
  }
  if (local_48 == (element_type *)0x0) {
    func(this,2,0.0);
    func(this,3,0.0);
  }
  else {
    (*local_48->_vptr_Term[3])(local_48,this);
    std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::_M_erase
              (&this->terms,iVar4);
  }
  iVar4._M_current =
       (this->terms).
       super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  psVar3 = (this->terms).
           super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar4._M_current != psVar3) {
    do {
      peVar1 = ((iVar4._M_current)->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar1->shift == this->balk_size) && (peVar1->initial_variable == false)) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&_Stack_50,
                   &((iVar4._M_current)->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount);
        local_58 = peVar1;
        break;
      }
      iVar4._M_current = iVar4._M_current + 1;
    } while (iVar4._M_current != psVar3);
  }
  if (local_58 == (element_type *)0x0) {
    func(this,2,(double)this->balk_size * this->segment_length);
    func(this,3,(double)this->balk_size * this->segment_length);
  }
  else {
    (*local_58->_vptr_Term[3])(local_58,this);
    std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::_M_erase
              (&this->terms,iVar4);
  }
  psVar2 = (this->terms).
           super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->terms).
                super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
                _M_impl.super__Vector_impl_data._M_start; psVar3 != psVar2; psVar3 = psVar3 + 1) {
    peVar1 = (psVar3->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar1->is_unknown == true) {
      (*peVar1->_vptr_Term[3])(peVar1,this);
    }
  }
  lu::solve(&local_30,&this->A,&this->b);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->x,&local_30);
  if (local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
  }
  return;
}

Assistant:

void Balk::solve_balk()
{
    // Count a number of unknown elements. Init with 4 because of initial variables.
    size_t unknown_num = 4;
    for (const auto &el : terms)
    {
        unknown_num += ((el->isUnknown()) && (el->getShift() != 0) && (el->getShift() != balk_size));
    }

    std::shared_ptr<Term> first = nullptr;
    std::shared_ptr<Term> last = nullptr;
    auto it = terms.begin();
    for (; it != terms.end(); ++it)
    {
        if ((it->get()->getShift() == 0) && !(it->get()->initial_variable))
        {
            first = *it;
            break;
        }
    }
    if (first == nullptr)
    { // Free begin
        func(2, 0);
        func(3, 0);
    }
    else
    {
        first->addAnEquation(*this);
        terms.erase(it);
    }

    it = terms.begin();
    for (; it != terms.end(); ++it)
    {
        if ((it->get()->getShift() == balk_size) && !(it->get()->initial_variable))
        {
            last = *it;
            break;
        }
    }
    if (last == nullptr)
    { // Free end
        func(2, segment_length * balk_size);
        func(3, segment_length * balk_size);
    }
    else
    {
        last->addAnEquation(*this);
        terms.erase(it);
    }

    for (const auto &el : terms)
    {
        if (el->isUnknown())
        {
            el->addAnEquation(*this);
        }
    }

    x = lu::solve(A, b);
}